

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

void __thiscall Fl_Preferences::Node::createIndex(Node *this)

{
  int iVar1;
  int iVar2;
  Node **ppNVar3;
  Node *pNVar4;
  
  if ((this->field_0x30 & 4) == 0) {
    iVar1 = nChildren(this);
    pNVar4 = this;
    iVar2 = iVar1;
    if (this->NIndex_ < iVar1) {
      this->NIndex_ = iVar1 + 0x10;
      ppNVar3 = (Node **)realloc(this->index_,(long)iVar1 * 8 + 0x80);
      this->index_ = ppNVar3;
    }
    while( true ) {
      pNVar4 = pNVar4->child_;
      if (pNVar4 == (Node *)0x0) break;
      this->index_[iVar2 + -1] = pNVar4;
      pNVar4 = (Node *)&pNVar4->next_;
      iVar2 = iVar2 + -1;
    }
    this->nIndex_ = iVar1;
    this->field_0x30 = this->field_0x30 | 4;
  }
  return;
}

Assistant:

void Fl_Preferences::Node::createIndex() {
  if (indexed_) return;
  int n = nChildren();
  if (n>NIndex_) {
    NIndex_ = n + 16;
    index_ = (Node**)realloc(index_, NIndex_*sizeof(Node**));
  }
  Node *nd;
  int i = 0;
  for (nd = child_; nd; nd = nd->next_, i++) {
    index_[n-i-1] = nd;
  }
  nIndex_ = n;
  indexed_ = 1;
}